

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy_allocator.h
# Opt level: O2

void * __thiscall cppcms::impl::buddy_allocator::malloc(buddy_allocator *this,size_t __size)

{
  int bit_size;
  page *ppVar1;
  
  bit_size = get_bits((__size + 0xf & 0xfffffffffffffff0) + 0x10);
  ppVar1 = page_alloc(this,bit_size);
  if (ppVar1 != (page *)0x0) {
    ppVar1 = (page *)&ppVar1->prev;
  }
  return ppVar1;
}

Assistant:

void *malloc(size_t required_size)
	{
		size_t n = ((required_size+alignment-1)/alignment + 1)*alignment;
		int bits = get_bits(n);

		
		LOG("Allocating chunk of size %zd (%d) for request of %zd",n,bits,required_size);
		page *p = page_alloc(bits);
		LOG("Got %zx",(p?(char*)(p) - memory():0));
		if(!p)
			return 0;
		void *r = reinterpret_cast<char *>(p) + alignment;
		return r;
	}